

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_thread.c
# Opt level: O1

int mk_http_thread_destroy(mk_http_thread *mth)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_thread *__ptr;
  void *__ptr_00;
  unsigned_long _zzq_args [6];
  
  __ptr_00 = pthread_getspecific(mk_http_thread_libco_params);
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
    pthread_setspecific(mk_http_thread_libco_params,(void *)0x0);
  }
  pmVar1 = (mth->_head).prev;
  pmVar2 = (mth->_head).next;
  pmVar1->next = pmVar2;
  pmVar2->prev = pmVar1;
  (mth->_head).prev = (mk_list *)0x0;
  (mth->_head).next = (mk_list *)0x0;
  __ptr = mth->parent;
  mth->session->channel->event->type = 3;
  if (__ptr->cb_destroy != (_func_void_void_ptr *)0x0) {
    (*__ptr->cb_destroy)(__ptr + 1);
  }
  co_delete(__ptr->callee);
  free(__ptr);
  return 0;
}

Assistant:

int mk_http_thread_destroy(struct mk_http_thread *mth)
{
    struct mk_thread *th;
    struct mk_http_libco_params *libco_params;

    libco_params = MK_TLS_GET(mk_http_thread_libco_params);

    if (libco_params != NULL) {
        mk_mem_free(libco_params);    
        MK_TLS_SET(mk_http_thread_libco_params, NULL);
    }

    /* Unlink from scheduler thread list */
    mk_list_del(&mth->_head);

    /* release original memory context */
    th = mth->parent;
    mth->session->channel->event->type = MK_EVENT_CONNECTION;
    mk_thread_destroy(th);

    return 0;
}